

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ulong uVar1;
  size_t __nbytes;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_00;
  ifstream *ifs;
  undefined1 local_5b8 [8];
  ISentenceReader iSentenceReader;
  IBlockReader iBlockReader;
  IForReader iForReader;
  IWhileReader iWhileReader;
  IIfAllReader iIfAllReader;
  ostream local_418 [8];
  ofstream my_ofs;
  ifstream local_218 [8];
  ifstream my_ifs;
  
  std::ifstream::ifstream(local_218,"I:\\IDE\\CLion\\ICDecoder\\input.txt",_S_in);
  std::ofstream::ofstream(local_418,"I:\\IDE\\CLion\\ICDecoder\\output.txt",_S_out);
  IIfAllReader::IIfAllReader
            ((IIfAllReader *)&iWhileReader.super_IBoolReader.field_0x58,local_218,local_418,0);
  IWhileReader::IWhileReader
            ((IWhileReader *)&iForReader.super_IAbstractReader.m_os,local_218,local_418,0);
  IForReader::IForReader((IForReader *)&iBlockReader.m_hasChild,local_218,local_418,0);
  IBlockReader::IBlockReader((IBlockReader *)&iSentenceReader.field_0x60,local_218,local_418,0);
  ifs = local_218;
  __nbytes = 0;
  ISentenceReader::ISentenceReader((ISentenceReader *)local_5b8,ifs,local_418,0,';');
  __buf = extraout_RDX;
  do {
    do {
      uVar1 = IAbstractReader::read
                        ((IAbstractReader *)&iBlockReader.m_hasChild,(int)ifs,__buf,__nbytes);
      __buf = __buf_00;
    } while ((uVar1 & 1) != 0);
    uVar1 = IAbstractReader::read
                      ((IAbstractReader *)&iForReader.super_IAbstractReader.m_os,(int)ifs,__buf_00,
                       __nbytes);
    __buf = __buf_01;
  } while (((((uVar1 & 1) != 0) ||
            (uVar1 = IAbstractReader::read
                               ((IAbstractReader *)&iWhileReader.super_IBoolReader.field_0x58,
                                (int)ifs,__buf_01,__nbytes), __buf = __buf_02, (uVar1 & 1) != 0)) ||
           (uVar1 = IAbstractReader::read
                              ((IAbstractReader *)&iSentenceReader.field_0x60,(int)ifs,__buf_02,
                               __nbytes), __buf = __buf_03, (uVar1 & 1) != 0)) ||
          (uVar1 = IAbstractReader::read((IAbstractReader *)local_5b8,(int)ifs,__buf_03,__nbytes),
          __buf = extraout_RDX_00, (uVar1 & 1) != 0));
  std::ifstream::close();
  std::ofstream::close();
  ISentenceReader::~ISentenceReader((ISentenceReader *)local_5b8);
  IBlockReader::~IBlockReader((IBlockReader *)&iSentenceReader.field_0x60);
  IForReader::~IForReader((IForReader *)&iBlockReader.m_hasChild);
  IWhileReader::~IWhileReader((IWhileReader *)&iForReader.super_IAbstractReader.m_os);
  IIfAllReader::~IIfAllReader((IIfAllReader *)&iWhileReader.super_IBoolReader.field_0x58);
  std::ofstream::~ofstream(local_418);
  std::ifstream::~ifstream(local_218);
  return 0;
}

Assistant:

int main() {
    std::ifstream my_ifs(R"(I:\IDE\CLion\ICDecoder\input.txt)",std::ios_base::in);
    std::ofstream my_ofs(R"(I:\IDE\CLion\ICDecoder\output.txt)",std::ios_base::out);
    IIfAllReader iIfAllReader(&my_ifs, &my_ofs, 0);
    IWhileReader iWhileReader(&my_ifs, &my_ofs, 0);
    IForReader iForReader(&my_ifs, &my_ofs, 0);
    IBlockReader iBlockReader(&my_ifs, &my_ofs, 0);
    ISentenceReader iSentenceReader(&my_ifs, &my_ofs, 0);

    while(true)
    {
        if(iForReader.read());
        else if(iWhileReader.read());
        else if(iIfAllReader.read());
        else if(iBlockReader.read());
        else if(iSentenceReader.read());
        else break;
    }

    my_ifs.close();
    my_ofs.close();
    return 0;
}